

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  double *pdVar1;
  Precision PVar2;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar3;
  ShaderExecutor *pSVar4;
  Variable<tcu::Vector<float,_2>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Vector<int,_2>_> *pVVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  IVal *pIVar12;
  IVal *pIVar13;
  undefined8 *puVar14;
  pointer pVVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_t sVar17;
  long lVar18;
  undefined1 auVar19 [8];
  TestStatus *pTVar20;
  IVal in2;
  FuncSet funcs;
  IVal reference1;
  IVal in3;
  Environment env;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_> outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffab8;
  undefined1 local_540 [8];
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  pointer local_520;
  undefined1 local_518 [8];
  undefined8 local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_508;
  _Base_ptr local_4f8;
  double dStack_4f0;
  IVal local_4e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0;
  size_t local_4d8;
  ulong local_4d0;
  long local_4c8;
  TestStatus *local_4c0;
  string local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [8];
  double dStack_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  double local_448;
  double dStack_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8 [2];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar2 = (this->m_caseCtx).precision;
  sVar17 = (this->m_caseCtx).numRandoms;
  local_4c0 = __return_storage_ptr__;
  iVar9 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<int,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar2,(Precision)sVar17,(ulong)(iVar9 + 0xdeadbeef),
             in_stack_fffffffffffffab8);
  local_520 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  sVar17 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2e8,sVar17);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_468 = (undefined1  [8])local_4e0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_460,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  local_510 = (double)((ulong)local_510._4_4_ << 0x20);
  aStack_508._M_allocated_capacity = 0;
  dStack_4f0 = 0.0;
  pSVar3 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_508._8_8_ = (_Rb_tree_node_base *)&local_510;
  local_4f8 = (_Rb_tree_node_base *)&local_510;
  local_4d8 = sVar17;
  (*pSVar3->_vptr_Statement[4])(pSVar3,local_518);
  if ((_Rb_tree_node_base *)aStack_508._8_8_ != (_Rb_tree_node_base *)&local_510) {
    uVar11 = aStack_508._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_1f8);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_510);
  }
  sVar17 = local_4d8;
  if (dStack_4f0 != 0.0) {
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_460,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_460,(char *)CONCAT44(local_540._4_4_,local_540._0_4_),local_538);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_540._4_4_,local_540._0_4_) != &local_530) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_540._4_4_,local_540._0_4_),
                      local_530._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar4 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar4->_vptr_ShaderExecutor[2])(pSVar4,sVar17 & 0xffffffff,&local_218,&local_288,0);
  local_468 = (undefined1  [8])((ulong)local_468 & 0xffffffffffffff00);
  dStack_460 = INFINITY;
  aStack_458._M_allocated_capacity = 0xfff0000000000000;
  aStack_458._8_4_ = aStack_458._8_4_ & 0xffffff00;
  local_448 = INFINITY;
  dStack_440 = -INFINITY;
  local_1f8[0].m_data[0]._0_8_ = local_1f8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_1f8[0].m_data[0].m_lo = INFINITY;
  local_1f8[0].m_data[0].m_hi = -INFINITY;
  local_1f8[0].m_data[1]._0_8_ = local_1f8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
  local_1f8[0].m_data[1].m_lo = INFINITY;
  local_1f8[0].m_data[1].m_hi = -INFINITY;
  local_518 = (undefined1  [8])((ulong)local_518 & 0xffffffffffffff00);
  local_510 = INFINITY;
  aStack_508._M_allocated_capacity = 0xfff0000000000000;
  aStack_508._8_8_ = aStack_508._8_8_ & 0xffffffffffffff00;
  local_4f8 = (_Base_ptr)0x7ff0000000000000;
  dStack_4f0 = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<tcu::Vector<int,2>>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr,
             local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_518);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_4e1);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_520) {
LAB_009bde79:
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"All ",4);
    pTVar20 = local_4c0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
    local_468 = (undefined1  [8])&aStack_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar20->m_code = QP_TEST_RESULT_PASS;
    (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar20->m_description,local_468,
               (char *)((long)local_468 + (long)dStack_460));
    uVar11 = aStack_458._M_allocated_capacity;
    auVar19 = local_468;
    if (local_468 == (undefined1  [8])&aStack_458) goto LAB_009be05e;
  }
  else {
    lVar18 = sVar17 + (sVar17 == 0);
    pVVar15 = (pointer)0x0;
    local_4d0 = 0;
    do {
      local_1f8[0].m_data[0]._0_8_ = local_1f8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
      local_1f8[0].m_data[0].m_lo = INFINITY;
      local_1f8[0].m_data[0].m_hi = -INFINITY;
      local_1f8[0].m_data[1]._0_8_ = local_1f8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
      local_1f8[0].m_data[1].m_lo = INFINITY;
      local_1f8[0].m_data[1].m_hi = -INFINITY;
      local_540._0_4_ =
           *(float *)((long)pVVar15->m_data +
                     (long)(local_278.in0.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data);
      local_540._4_4_ =
           *(float *)((long)((local_278.in0.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + 1) +
                     (long)pVVar15);
      local_520 = pVVar15;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_518,fmt,(Vector<float,_2> *)local_540);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_518);
      pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar12->m_data[1].m_lo = local_448;
      pIVar12->m_data[1].m_hi = dStack_440;
      pIVar12->m_data[0].m_hi = (double)aStack_458._M_allocated_capacity;
      *(ulong *)(pIVar12->m_data + 1) = CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      pIVar12->m_data[0].m_hasNaN = local_468;
      pIVar12->m_data[0].m_lo = dStack_460;
      local_540._0_4_ =
           *(float *)((long)local_520->m_data +
                     (long)(local_278.in1.
                            super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data);
      local_540._4_4_ =
           *(float *)((long)((local_278.in1.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + 1) +
                     (long)local_520);
      ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_518,fmt,(Vector<int,_2> *)local_540);
      ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,fmt,(IVal *)local_518);
      pIVar13 = Environment::lookup<tcu::Vector<int,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>
                           .m_ptr);
      pIVar13->m_data[1].m_lo = local_448;
      pIVar13->m_data[1].m_hi = dStack_440;
      pIVar13->m_data[0].m_hi = (double)aStack_458._M_allocated_capacity;
      *(ulong *)(pIVar13->m_data + 1) = CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      pIVar13->m_data[0].m_hasNaN = local_468;
      pIVar13->m_data[0].m_lo = dStack_460;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_4c8 = lVar18;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_448 = (this->m_caseCtx).floatFormat.m_maxValue;
      local_468 = *(undefined1 (*) [8])fmt;
      dStack_460 = *(double *)&(this->m_caseCtx).floatFormat.m_fractionBits;
      aStack_458._M_allocated_capacity = *(undefined8 *)&(this->m_caseCtx).floatFormat.m_hasInf;
      aStack_458._8_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.m_exactPrecision;
      aStack_458._12_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
      dStack_440 = (double)CONCAT44(dStack_440._4_4_,(this->m_caseCtx).precision);
      local_430 = 0;
      pSVar3 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_438 = &local_498;
      (*pSVar3->_vptr_Statement[3])(pSVar3,local_468);
      pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,&local_2b8,pIVar12);
      local_1f8[0].m_data[1]._0_8_ = CONCAT44(aStack_458._12_4_,aStack_458._8_4_);
      local_1f8[0].m_data[1].m_lo = local_448;
      local_1f8[0].m_data[1].m_hi = dStack_440;
      local_1f8[0].m_data[0].m_hi = (double)aStack_458._M_allocated_capacity;
      local_1f8[0].m_data[0]._0_8_ = local_468;
      local_1f8[0].m_data[0].m_lo = dStack_460;
      bVar8 = contains<tcu::Vector<float,2>>
                        (local_1f8,
                         (Vector<float,_2> *)
                         ((long)local_520->m_data +
                         (long)(local_2e8.out0.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data));
      local_468 = (undefined1  [8])&aStack_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(&local_80,bVar8,(string *)local_468);
      if (local_468 != (undefined1  [8])&aStack_458) {
        operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
      }
      lVar18 = local_4c8;
      if (!bVar8) {
        uVar10 = (int)local_4d0 + 1;
        local_4d0 = (ulong)uVar10;
        if ((int)uVar10 < 0x65) {
          local_468 = (undefined1  [8])local_4e0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"Failed",6);
          lVar18 = local_4c8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar5 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          paVar16 = &aStack_508;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_518 = (undefined1  [8])paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_518,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_518,(long)local_510);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_540,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     ((long)local_520->m_data +
                     (long)(local_278.in0.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data),
                     (Vector<float,_2> *)&paVar16->_M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_540._4_4_,local_540._0_4_),
                     local_538);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_540._4_4_,local_540._0_4_) != &local_530) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_540._4_4_,local_540._0_4_),
                            local_530._M_allocated_capacity + 1);
          }
          if (local_518 != (undefined1  [8])&aStack_508) {
            operator_delete((void *)local_518,(ulong)(aStack_508._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar7 = (this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr
          ;
          paVar16 = &aStack_508;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          local_518 = (undefined1  [8])paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_518,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_518,(long)local_510);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<int,2>>
                    ((string *)local_540,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     ((long)local_520->m_data +
                     (long)(local_278.in1.
                            super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data),
                     (Vector<int,_2> *)&paVar16->_M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_540._4_4_,local_540._0_4_),
                     local_538);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_540._4_4_,local_540._0_4_) != &local_530) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_540._4_4_,local_540._0_4_),
                            local_530._M_allocated_capacity + 1);
          }
          if (local_518 != (undefined1  [8])&aStack_508) {
            operator_delete((void *)local_518,(ulong)(aStack_508._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\t",1);
          pVVar5 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          paVar16 = &aStack_508;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_518 = (undefined1  [8])paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_518,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)local_518,(long)local_510);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_540,(shaderexecutor *)&local_2b8,
                     (FloatFormat *)
                     ((long)local_520->m_data +
                     (long)(local_2e8.out0.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data),
                     (Vector<float,_2> *)&paVar16->_M_allocated_capacity);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,(char *)CONCAT44(local_540._4_4_,local_540._0_4_),
                     local_538);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_4b8,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1f8,
                     (IVal *)paVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_460,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_540._4_4_,local_540._0_4_) != &local_530) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_540._4_4_,local_540._0_4_),
                            local_530._M_allocated_capacity + 1);
          }
          if (local_518 != (undefined1  [8])&aStack_508) {
            operator_delete((void *)local_518,(ulong)(aStack_508._M_allocated_capacity + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
          std::ios_base::~ios_base(local_3f0);
        }
      }
      pVVar15 = local_520 + 1;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
    iVar9 = (int)local_4d0;
    if (iVar9 < 0x65) {
      if (iVar9 == 0) goto LAB_009bde79;
    }
    else {
      local_468 = (undefined1  [8])local_4e0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_460,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
      std::ios_base::~ios_base(local_3f0);
    }
    local_468 = (undefined1  [8])local_4e0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_460);
    std::ostream::operator<<((ostringstream *)&dStack_460,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_460," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_460);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar9);
    pTVar20 = local_4c0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468 = (undefined1  [8])&aStack_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    uVar11 = (_Base_ptr)0xf;
    if (local_518 != (undefined1  [8])&aStack_508) {
      uVar11 = aStack_508._M_allocated_capacity;
    }
    if ((ulong)uVar11 < (_Base_ptr)((long)dStack_460 + (long)local_510)) {
      uVar11 = (_Base_ptr)0xf;
      if (local_468 != (undefined1  [8])&aStack_458) {
        uVar11 = aStack_458._M_allocated_capacity;
      }
      if ((ulong)uVar11 < (_Base_ptr)((long)dStack_460 + (long)local_510)) goto LAB_009bde6a;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,(ulong)local_518);
    }
    else {
LAB_009bde6a:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_518,(ulong)local_468);
    }
    local_1f8[0].m_data[0]._0_8_ = &local_1f8[0].m_data[0].m_hi;
    pdVar1 = (double *)(puVar14 + 2);
    if ((double *)*puVar14 == pdVar1) {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[1]._0_8_ = puVar14[3];
    }
    else {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[0]._0_8_ = (double *)*puVar14;
    }
    local_1f8[0].m_data[0].m_lo = (double)puVar14[1];
    *puVar14 = pdVar1;
    puVar14[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar20->m_code = QP_TEST_RESULT_FAIL;
    (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar20->m_description,local_1f8[0].m_data[0]._0_8_,
               (undefined1 *)(local_1f8[0].m_data[0]._0_8_ + (long)local_1f8[0].m_data[0].m_lo));
    if ((double *)local_1f8[0].m_data[0]._0_8_ != &local_1f8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1f8[0].m_data[0]._0_8_,
                      (ulong)((long)(_Rb_tree_color *)local_1f8[0].m_data[0].m_hi + 1));
    }
    if (local_468 != (undefined1  [8])&aStack_458) {
      operator_delete((void *)local_468,(ulong)(aStack_458._M_allocated_capacity + 1));
    }
    uVar11 = aStack_508._M_allocated_capacity;
    auVar19 = local_518;
    if (local_518 == (undefined1  [8])&aStack_508) goto LAB_009be05e;
  }
  operator_delete((void *)auVar19,(ulong)((long)&((_Base_ptr)uVar11)->_M_color + 1));
LAB_009be05e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar20;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}